

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

string * __thiscall
libtorrent::aux::torrent::save_path_abi_cxx11_(string *__return_storage_ptr__,torrent *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_save_path);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent::save_path() const
	{
		return m_save_path;
	}